

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptInitializer(HlslGrammar *this,TIntermTyped **node)

{
  bool bVar1;
  int iVar2;
  TIntermAggregate *pTVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  TIntermTyped *pTStack_40;
  bool firstNode;
  TIntermTyped *expr;
  TSourceLoc loc;
  TIntermTyped **node_local;
  HlslGrammar *this_local;
  
  loc._16_8_ = node;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  if (bVar1) {
    expr = (TIntermTyped *)(this->super_HlslTokenStream).token.loc.name;
    loc.name = *(TString **)&(this->super_HlslTokenStream).token.loc.string;
    loc.string = (this->super_HlslTokenStream).token.loc.column;
    loc.line = *(int *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
    if (bVar1) {
      pTVar3 = TIntermediate::makeAggregate(this->intermediate,(TSourceLoc *)&expr);
      *(TIntermAggregate **)loc._16_8_ = pTVar3;
      this_local._7_1_ = true;
    }
    else {
      *(undefined8 *)loc._16_8_ = 0;
      do {
        bVar1 = acceptAssignmentExpression(this,&stack0xffffffffffffffc0);
        if (!bVar1) {
          expected(this,"assignment expression in initializer list");
          return false;
        }
        lVar4 = *(long *)loc._16_8_;
        pTVar3 = TIntermediate::growAggregate
                           (this->intermediate,*(TIntermNode **)loc._16_8_,
                            &pTStack_40->super_TIntermNode,(TSourceLoc *)&expr);
        *(TIntermAggregate **)loc._16_8_ = pTVar3;
        if ((lVar4 == 0) &&
           (iVar2 = (*(pTStack_40->super_TIntermNode)._vptr_TIntermNode[0x21])(),
           ((uint)*(undefined8 *)(CONCAT44(extraout_var,iVar2) + 8) & 0x7f) == 2)) {
          lVar4 = (**(code **)(**(long **)loc._16_8_ + 0x108))();
          *(ulong *)(lVar4 + 8) = *(ulong *)(lVar4 + 8) & 0xffffffffffffff80 | 2;
        }
        else {
          iVar2 = (*(pTStack_40->super_TIntermNode)._vptr_TIntermNode[0x21])();
          if (((uint)*(undefined8 *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0x7f) != 2) {
            lVar4 = (**(code **)(**(long **)loc._16_8_ + 0x108))();
            *(ulong *)(lVar4 + 8) = *(ulong *)(lVar4 + 8) & 0xffffffffffffff80;
          }
        }
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
        if (!bVar1) {
          bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
          if (!bVar1) {
            expected(this,", or }");
            return false;
          }
          return true;
        }
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
      } while (!bVar1);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptInitializer(TIntermTyped*& node)
{
    // LEFT_BRACE
    if (! acceptTokenClass(EHTokLeftBrace))
        return false;

    // RIGHT_BRACE
    TSourceLoc loc = token.loc;
    if (acceptTokenClass(EHTokRightBrace)) {
        // a zero-length initializer list
        node = intermediate.makeAggregate(loc);
        return true;
    }

    // initializer_list
    node = nullptr;
    do {
        // assignment_expression
        TIntermTyped* expr;
        if (! acceptAssignmentExpression(expr)) {
            expected("assignment expression in initializer list");
            return false;
        }

        const bool firstNode = (node == nullptr);

        node = intermediate.growAggregate(node, expr, loc);

        // If every sub-node in the list has qualifier EvqConst, the returned node becomes
        // EvqConst.  Otherwise, it becomes EvqTemporary. That doesn't happen with e.g.
        // EvqIn or EvqPosition, since the collection isn't EvqPosition if all the members are.
        if (firstNode && expr->getQualifier().storage == EvqConst)
            node->getQualifier().storage = EvqConst;
        else if (expr->getQualifier().storage != EvqConst)
            node->getQualifier().storage = EvqTemporary;

        // COMMA
        if (acceptTokenClass(EHTokComma)) {
            if (acceptTokenClass(EHTokRightBrace))  // allow trailing comma
                return true;
            continue;
        }

        // RIGHT_BRACE
        if (acceptTokenClass(EHTokRightBrace))
            return true;

        expected(", or }");
        return false;
    } while (true);
}